

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_instructions.c
# Opt level: O1

uint8_t implied_BRK(cpu_registers *registers)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = registers->PC + 1;
  push_stack(registers,(uint8_t)((uint)iVar2 >> 8));
  push_stack(registers,(uint8_t)iVar2);
  push_stack(registers,registers->flags | 0x30);
  bVar1 = read_RAM(0xffff);
  registers->PC = (ushort)bVar1 << 8;
  bVar1 = read_RAM(0xfffe);
  registers->PC = registers->PC | (ushort)bVar1;
  set_cpu_flag(registers,'\x04');
  return '\0';
}

Assistant:

uint8_t implied_BRK(cpu_registers* registers) {
    // BRK sets these two bits for some reason
    uint8_t BRK_special_flags = 0x30;
    // Pushes PC + 2 from instruction fetch for some reason
    push_PC_onto_stack(registers, registers->PC + 1);
    push_stack(registers, registers->flags | BRK_special_flags);
    load_IRQ_vector_into_PC(registers);
    set_cpu_flag(registers, INTERRUPT_FLAG);
    return ZERO_EXTRA_CYCLES;
}